

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O2

void __thiscall libcellml::Component::removeAllResets(Component *this)

{
  EntityImpl *pEVar1;
  undefined8 *puVar2;
  ResetImpl *this_00;
  shared_ptr<libcellml::Reset> *reset;
  undefined8 *puVar3;
  
  pEVar1 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  puVar2 = *(undefined8 **)((long)&pEVar1[5].mId.field_2 + 8);
  for (puVar3 = (undefined8 *)pEVar1[5].mId.field_2._M_allocated_capacity; puVar3 != puVar2;
      puVar3 = puVar3 + 2) {
    this_00 = Reset::pFunc((Reset *)*puVar3);
    ParentedEntity::ParentedEntityImpl::removeParent(&this_00->super_ParentedEntityImpl);
  }
  std::
  vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>::
  clear((vector<std::shared_ptr<libcellml::Reset>,_std::allocator<std::shared_ptr<libcellml::Reset>_>_>
         *)&(this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl
            [5].mId.field_2);
  return;
}

Assistant:

void Component::removeAllResets()
{
    for (const auto &reset : pFunc()->mResets) {
        reset->pFunc()->removeParent();
    }
    pFunc()->mResets.clear();
}